

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O1

void __thiscall llvm::raw_ostream::~raw_ostream(raw_ostream *this)

{
  char *pcVar1;
  
  this->_vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_0023fba8;
  pcVar1 = this->OutBufStart;
  if (this->OutBufCur != pcVar1) {
    __assert_fail("OutBufCur == OutBufStart && \"raw_ostream destructor called with non-empty buffer!\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/raw_ostream.cpp"
                  ,0x48,"virtual llvm::raw_ostream::~raw_ostream()");
  }
  if ((pcVar1 != (char *)0x0) && (this->BufferMode == InternalBuffer)) {
    operator_delete__(pcVar1);
    return;
  }
  return;
}

Assistant:

raw_ostream::~raw_ostream() {
  // raw_ostream's subclasses should take care to flush the buffer
  // in their destructors.
  assert(OutBufCur == OutBufStart &&
         "raw_ostream destructor called with non-empty buffer!");

  if (BufferMode == InternalBuffer)
    delete [] OutBufStart;
}